

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O3

void P_SpawnPushers(void)

{
  uint uVar1;
  int iVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  DPusher *pDVar5;
  int iVar6;
  line_t_conflict *plVar7;
  line_t_conflict *plVar8;
  FSectorTagIterator itr;
  FSectorTagIterator local_38;
  undefined4 extraout_var;
  
  if (0 < numlines) {
    iVar6 = 0;
    plVar8 = lines;
    do {
      iVar2 = plVar8->special;
      if (iVar2 == 0xe3) {
        iVar2 = plVar8->args[0];
        if (iVar2 == 0) {
          uVar1 = plVar8->args[1];
          if (uVar1 != 0) {
            for (pAVar3 = AActor::TIDHash[uVar1 & 0x7f]; pAVar3 != (AActor *)0x0;
                pAVar3 = pAVar3->inext) {
              while (pAVar3->tid == uVar1) {
                pPVar4 = (pAVar3->super_DThinker).super_DObject.Class;
                if (pPVar4 == (PClass *)0x0) {
                  iVar2 = (**(pAVar3->super_DThinker).super_DObject._vptr_DObject)(pAVar3);
                  pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
                  (pAVar3->super_DThinker).super_DObject.Class = pPVar4;
                }
                if (((pPVar4->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index &
                    0xfffffffeU) == 0x3c) {
                  pDVar5 = (DPusher *)
                           M_Malloc_Dbg(0x70,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                        ,0x1f9);
                  plVar7 = (line_t_conflict *)0x0;
                  if (plVar8->args[3] != 0) {
                    plVar7 = plVar8;
                  }
                  DPusher::DPusher(pDVar5,p_push,(line_t *)plVar7,plVar8->args[2],0,pAVar3,
                                   (int)((ulong)((long)pAVar3->Sector - (long)sectors) >> 3) *
                                   0x7a44c6b);
                }
                pAVar3 = pAVar3->inext;
                if (pAVar3 == (AActor *)0x0) goto LAB_0043d945;
              }
            }
          }
        }
        else {
          local_38.start = tagManager.TagHashFirst[(byte)iVar2];
          local_38.searchtag = iVar2;
          iVar2 = FSectorTagIterator::Next(&local_38);
          while (-1 < iVar2) {
            pAVar3 = P_GetPushThing(iVar2);
            if ((pAVar3 != (AActor *)0x0) &&
               ((plVar8->args[1] == 0 || (plVar8->args[1] == pAVar3->tid)))) {
              pDVar5 = (DPusher *)
                       M_Malloc_Dbg(0x70,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                    ,0x1f9);
              plVar7 = (line_t_conflict *)0x0;
              if (plVar8->args[3] != 0) {
                plVar7 = plVar8;
              }
              DPusher::DPusher(pDVar5,p_push,(line_t *)plVar7,plVar8->args[2],0,pAVar3,iVar2);
            }
            iVar2 = FSectorTagIterator::Next(&local_38);
          }
        }
LAB_0043d945:
        plVar8->special = 0;
      }
      else {
        if (iVar2 == 0xdc) {
          local_38.searchtag = plVar8->args[0];
          if (local_38.searchtag == 0) {
            local_38.start = 0;
          }
          else {
            local_38.start = tagManager.TagHashFirst[(byte)local_38.searchtag];
          }
          while (iVar2 = FSectorTagIterator::Next(&local_38), -1 < iVar2) {
            pDVar5 = (DPusher *)
                     M_Malloc_Dbg(0x70,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
            plVar7 = plVar8;
            if (plVar8->args[3] == 0) {
              plVar7 = (line_t_conflict *)0x0;
            }
            DPusher::DPusher(pDVar5,p_current,(line_t *)plVar7,plVar8->args[1],plVar8->args[2],
                             (AActor *)0x0,iVar2);
          }
          goto LAB_0043d945;
        }
        if (iVar2 == 0xda) {
          local_38.searchtag = plVar8->args[0];
          if (local_38.searchtag == 0) {
            local_38.start = 0;
          }
          else {
            local_38.start = tagManager.TagHashFirst[(byte)local_38.searchtag];
          }
          while (iVar2 = FSectorTagIterator::Next(&local_38), -1 < iVar2) {
            pDVar5 = (DPusher *)
                     M_Malloc_Dbg(0x70,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
            plVar7 = plVar8;
            if (plVar8->args[3] == 0) {
              plVar7 = (line_t_conflict *)0x0;
            }
            DPusher::DPusher(pDVar5,p_wind,(line_t *)plVar7,plVar8->args[1],plVar8->args[2],
                             (AActor *)0x0,iVar2);
          }
          goto LAB_0043d945;
        }
      }
      iVar6 = iVar6 + 1;
      plVar8 = plVar8 + 1;
    } while (iVar6 < numlines);
  }
  return;
}

Assistant:

void P_SpawnPushers ()
{
	int i;
	line_t *l = lines;
	int s;

	for (i = 0; i < numlines; i++, l++)
	{
		switch (l->special)
		{
		case Sector_SetWind: // wind
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_wind, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case Sector_SetCurrent: // current
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_current, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case PointPush_SetForce: // push/pull
			if (l->args[0]) {	// [RH] Find thing by sector
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					AActor *thing = P_GetPushThing (s);
					if (thing) {	// No MT_P* means no effect
						// [RH] Allow narrowing it down by tid
						if (!l->args[1] || l->args[1] == thing->tid)
							new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
										 0, thing, s);
					}
				}
			} else {	// [RH] Find thing by tid
				AActor *thing;
				FActorIterator iterator (l->args[1]);

				while ( (thing = iterator.Next ()) )
				{
					if (thing->GetClass()->TypeName == NAME_PointPusher ||
						thing->GetClass()->TypeName == NAME_PointPuller)
					{
						new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
									 0, thing, int(thing->Sector - sectors));
					}
				}
			}
			l->special = 0;
			break;
		}
	}
}